

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O0

wchar_t breath_dam(wchar_t type,wchar_t hp)

{
  wchar_t local_1c;
  wchar_t dam;
  projection *element;
  wchar_t hp_local;
  wchar_t type_local;
  
  local_1c = hp / projections[type].divisor;
  if (projections[type].damage_cap < local_1c) {
    local_1c = projections[type].damage_cap;
  }
  return local_1c;
}

Assistant:

int breath_dam(int type, int hp)
{
	struct projection *element = &projections[type];
	int dam;

	/* Damage is based on monster's current hp */
	dam = hp / element->divisor;

	/* Check for maximum damage */
	if (dam > element->damage_cap)
		dam = element->damage_cap;

	return dam;
}